

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_executor.hpp
# Opt level: O0

void duckdb::BinaryExecutor::
     ExecuteFlat<unsigned_long,unsigned_long,unsigned_long,duckdb::BinaryStandardOperatorWrapper,duckdb::BitwiseShiftRightOperator,bool,true,false>
               (Vector *left,Vector *right,Vector *result,idx_t count,bool fun)

{
  byte bVar1;
  bool bVar2;
  unsigned_long *count_00;
  TemplatedValidityMask<unsigned_long> *in_RCX;
  Vector *in_RDX;
  byte in_R8B;
  ValidityMask *result_validity;
  unsigned_long *result_data;
  unsigned_long *rdata;
  unsigned_long *ldata;
  undefined7 in_stack_00000030;
  Vector *in_stack_ffffffffffffffb0;
  undefined7 in_stack_ffffffffffffffd8;
  
  bVar1 = in_R8B & 1;
  count_00 = FlatVector::GetData<unsigned_long>((Vector *)0xe8693b);
  FlatVector::GetData<unsigned_long>((Vector *)0xe8694a);
  bVar2 = ConstantVector::IsNull((Vector *)0xe86959);
  if (bVar2) {
    duckdb::Vector::SetVectorType((VectorType)in_RDX);
    duckdb::ConstantVector::SetNull(in_RDX,true);
  }
  else {
    duckdb::Vector::SetVectorType((VectorType)in_RDX);
    FlatVector::GetData<unsigned_long>((Vector *)0xe86998);
    FlatVector::Validity((Vector *)0xe869a7);
    bVar2 = BinaryStandardOperatorWrapper::AddsNulls();
    if (bVar2) {
      FlatVector::Validity((Vector *)0xe869cb);
      TemplatedValidityMask<unsigned_long>::Copy
                (in_RCX,(TemplatedValidityMask<unsigned_long> *)
                        CONCAT17(bVar1,in_stack_ffffffffffffffd8),(idx_t)count_00);
    }
    else {
      FlatVector::Validity((Vector *)0xe869f2);
      FlatVector::SetValidity(in_stack_ffffffffffffffb0,(ValidityMask *)in_RDX);
    }
    ExecuteFlatLoop<unsigned_long,unsigned_long,unsigned_long,duckdb::BinaryStandardOperatorWrapper,duckdb::BitwiseShiftRightOperator,bool,true,false>
              ((unsigned_long *)result,(unsigned_long *)count,
               (unsigned_long *)CONCAT17(fun,in_stack_00000030),(idx_t)ldata,(ValidityMask *)rdata,
               result_data._7_1_);
  }
  return;
}

Assistant:

static void ExecuteFlat(Vector &left, Vector &right, Vector &result, idx_t count, FUNC fun) {
		auto ldata = FlatVector::GetData<LEFT_TYPE>(left);
		auto rdata = FlatVector::GetData<RIGHT_TYPE>(right);

		if ((LEFT_CONSTANT && ConstantVector::IsNull(left)) || (RIGHT_CONSTANT && ConstantVector::IsNull(right))) {
			// either left or right is constant NULL: result is constant NULL
			result.SetVectorType(VectorType::CONSTANT_VECTOR);
			ConstantVector::SetNull(result, true);
			return;
		}

		result.SetVectorType(VectorType::FLAT_VECTOR);
		auto result_data = FlatVector::GetData<RESULT_TYPE>(result);
		auto &result_validity = FlatVector::Validity(result);
		if (LEFT_CONSTANT) {
			if (OPWRAPPER::AddsNulls()) {
				result_validity.Copy(FlatVector::Validity(right), count);
			} else {
				FlatVector::SetValidity(result, FlatVector::Validity(right));
			}
		} else if (RIGHT_CONSTANT) {
			if (OPWRAPPER::AddsNulls()) {
				result_validity.Copy(FlatVector::Validity(left), count);
			} else {
				FlatVector::SetValidity(result, FlatVector::Validity(left));
			}
		} else {
			if (OPWRAPPER::AddsNulls()) {
				result_validity.Copy(FlatVector::Validity(left), count);
				if (result_validity.AllValid()) {
					result_validity.Copy(FlatVector::Validity(right), count);
				} else {
					result_validity.Combine(FlatVector::Validity(right), count);
				}
			} else {
				FlatVector::SetValidity(result, FlatVector::Validity(left));
				result_validity.Combine(FlatVector::Validity(right), count);
			}
		}
		ExecuteFlatLoop<LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE, OPWRAPPER, OP, FUNC, LEFT_CONSTANT, RIGHT_CONSTANT>(
		    ldata, rdata, result_data, count, result_validity, fun);
	}